

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsSetUploadSize(SessionHandle *data,curl_off_t size)

{
  curl_off_t size_local;
  SessionHandle *data_local;
  
  if (size < 0) {
    (data->progress).size_ul = 0;
    (data->progress).flags = (data->progress).flags & 0xffffffdf;
  }
  else {
    (data->progress).size_ul = size;
    (data->progress).flags = (data->progress).flags | 0x20;
  }
  return;
}

Assistant:

void Curl_pgrsSetUploadSize(struct SessionHandle *data, curl_off_t size)
{
  if(size >= 0) {
    data->progress.size_ul = size;
    data->progress.flags |= PGRS_UL_SIZE_KNOWN;
  }
  else {
    data->progress.size_ul = 0;
    data->progress.flags &= ~PGRS_UL_SIZE_KNOWN;
  }
}